

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double coupon_complete_pdf(int type_num,int box_num)

{
  int iVar1;
  undefined8 local_28;
  double pdf;
  double dStack_18;
  int i;
  double factor;
  int box_num_local;
  int type_num_local;
  
  if (box_num < 0) {
    local_28 = 0.0;
  }
  else if (type_num < 1) {
    local_28 = 0.0;
  }
  else if (type_num == 1) {
    if (box_num == 1) {
      local_28 = 1.0;
    }
    else {
      local_28 = 0.0;
    }
  }
  else if (box_num < type_num) {
    local_28 = 0.0;
  }
  else {
    dStack_18 = 1.0;
    for (pdf._4_4_ = 1; pdf._4_4_ <= type_num; pdf._4_4_ = pdf._4_4_ + 1) {
      dStack_18 = (dStack_18 * (double)pdf._4_4_) / (double)type_num;
    }
    for (pdf._4_4_ = type_num + 1; pdf._4_4_ <= box_num; pdf._4_4_ = pdf._4_4_ + 1) {
      dStack_18 = dStack_18 / (double)type_num;
    }
    iVar1 = stirling2_value(box_num + -1,type_num + -1);
    local_28 = dStack_18 * (double)iVar1;
  }
  return local_28;
}

Assistant:

double coupon_complete_pdf ( int type_num, int box_num )

//****************************************************************************80
//
//  Purpose:
//
//    COUPON_COMPLETE_PDF evaluates the Complete Coupon Collection PDF.
//
//  Discussion:
//
//    PDF(TYPE_NUM;BOX_NUM) is the probability that, given an inexhaustible
//    supply of boxes, inside each of which there is one of TYPE_NUM distinct
//    coupons, which are uniformly distributed among the boxes, that it will
//    require opening exactly BOX_NUM boxes to achieve at least one of each
//    kind of coupon.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    25 August 2006
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Herbert Wilf,
//    Some New Aspects of the Coupon Collector's Problem,
//    SIAM Review,
//    Volume 48, Number 3, September 2006, pages 549-565.
//
//  Parameters:
//
//    Input, int BOX_NUM, the number of boxes that had to be opened
//    in order to just get at least one of each coupon.
//    0 <= BOX_NUM.  If BOX_NUM < TYPE_NUM, then PDF is surely 0.
//
//    Input, int TYPE_NUM, the number of distinct coupons.
//    1 <= TYPE_NUM.
//
//    Output, double COUPON_COMPLETE_PDF, the value of the PDF.
//
{
  double factor;
  int i;
  double pdf;
//
//  Nonsense cases.
//
  if ( box_num < 0 )
  {
    pdf = 0.0;
  }
  else if ( type_num < 1 )
  {
    pdf = 0.0;
  }
//
//  Degenerate but meaningful case.
//
  else if ( type_num == 1 )
  {
    if ( box_num == 1 )
    {
      pdf = 1.0;
    }
    else
    {
      pdf = 0.0;
    }
  }
//
//  Easy cases.
//
  else if ( box_num < type_num )
  {
    pdf = 0.0;
  }
//
//  General case.
//
  else
  {
    factor = 1.0;
    for ( i = 1; i <= type_num; i++ )
    {
      factor = factor * static_cast<double>(i ) / static_cast<double>(type_num );
    }
    for ( i = type_num+1; i <= box_num; i++ )
    {
      factor = factor / static_cast<double>(type_num );
    }
    pdf = factor * static_cast< double >( stirling2_value ( box_num-1, type_num-1 ) );
  }
  return pdf;
}